

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O0

Mesh * vera::icosphereMesh(Mesh *__return_storage_ptr__,float _radius,size_t _iterations)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  value_type vVar4;
  initializer_list<unsigned_int> __l;
  value_type_conflict4 vVar5;
  reference pvVar6;
  size_type sVar7;
  reference pvVar8;
  value_type *pvVar9;
  reference pvVar10;
  uint *puVar11;
  size_type sVar12;
  int __x;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  *this;
  vector<int,_std::allocator<int>_> *pvVar13;
  float fVar14;
  float fVar15;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  double dVar16;
  vec<3,_float,_(glm::qualifier)0> vVar17;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_878;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_874;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_798;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_794;
  ulong local_608;
  size_t i_4;
  uint32_t index2;
  uint32_t index1;
  size_t j;
  size_t newIndex;
  vec<2,_float,_(glm::qualifier)0> local_5d8;
  vec2 t;
  vec3 v_1;
  uint32_t index;
  size_t i_3;
  value_type local_5b0;
  value_type local_5ac;
  value_type local_5a8;
  value_type local_5a4;
  value_type local_5a0;
  vec2 t2;
  vec2 t1;
  vec2 t0;
  size_t i_2;
  vector<int,_std::allocator<int>_> indexToSplit;
  float alpha;
  float r0;
  float v;
  float u;
  value_type *vec;
  size_t i_1;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texCoords;
  value_type_conflict4 local_520;
  value_type_conflict4 local_51c;
  value_type_conflict4 local_518;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_514;
  value_type_conflict4 local_510;
  value_type_conflict4 local_50c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_508;
  value_type_conflict4 local_504;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_500;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_4fc;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_4f8;
  vec<3,_float,_(glm::qualifier)0> local_4f0;
  vec<3,_float,_(glm::qualifier)0> local_4e0;
  value_type local_4d0;
  vec<3,_float,_(glm::qualifier)0> local_4c0;
  vec<3,_float,_(glm::qualifier)0> local_4b0;
  vec<3,_float,_(glm::qualifier)0> local_4a0;
  vec<3,_float,_(glm::qualifier)0> local_490;
  vec<3,_float,_(glm::qualifier)0> local_480;
  vec<3,_float,_(glm::qualifier)0> local_470;
  vec<3,_float,_(glm::qualifier)0> local_460;
  vec<3,_float,_(glm::qualifier)0> local_450;
  undefined1 local_440 [8];
  vec3 v3;
  vec3 v2;
  vec3 v1;
  size_t i13;
  size_t i23;
  size_t i12;
  value_type local_3f0;
  uint32_t i3;
  uint32_t i2;
  uint32_t i1;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> newFaces;
  size_t iteration;
  size_t size;
  uint local_3b0 [60];
  iterator local_2c0;
  size_type local_2b8;
  undefined1 local_2b0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  vec<3,_float,_(glm::qualifier)0> local_284;
  value_type local_278;
  vec<3,_float,_(glm::qualifier)0> local_268;
  vec<3,_float,_(glm::qualifier)0> local_254;
  vec<3,_float,_(glm::qualifier)0> local_248;
  vec<3,_float,_(glm::qualifier)0> local_238;
  vec<3,_float,_(glm::qualifier)0> local_224;
  vec<3,_float,_(glm::qualifier)0> local_218;
  vec<3,_float,_(glm::qualifier)0> local_208;
  vec<3,_float,_(glm::qualifier)0> local_1f4;
  vec<3,_float,_(glm::qualifier)0> local_1e8;
  vec<3,_float,_(glm::qualifier)0> local_1d8;
  vec<3,_float,_(glm::qualifier)0> local_1c4;
  vec<3,_float,_(glm::qualifier)0> local_1b8;
  vec<3,_float,_(glm::qualifier)0> local_1a8;
  vec<3,_float,_(glm::qualifier)0> local_194;
  vec<3,_float,_(glm::qualifier)0> local_188;
  vec<3,_float,_(glm::qualifier)0> local_178;
  vec<3,_float,_(glm::qualifier)0> local_164;
  vec<3,_float,_(glm::qualifier)0> local_158;
  vec<3,_float,_(glm::qualifier)0> local_148;
  vec<3,_float,_(glm::qualifier)0> local_134;
  vec<3,_float,_(glm::qualifier)0> local_128;
  vec<3,_float,_(glm::qualifier)0> local_118;
  vec<3,_float,_(glm::qualifier)0> local_104;
  vec<3,_float,_(glm::qualifier)0> local_f8;
  vec<3,_float,_(glm::qualifier)0> local_e8;
  vec<3,_float,_(glm::qualifier)0> local_d4;
  vec<3,_float,_(glm::qualifier)0> local_c8;
  vec<3,_float,_(glm::qualifier)0> local_b8;
  vec<3,_float,_(glm::qualifier)0> local_a4;
  vec<3,_float,_(glm::qualifier)0> local_98;
  vec<3,_float,_(glm::qualifier)0> local_88;
  vec<3,_float,_(glm::qualifier)0> local_64;
  vec<3,_float,_(glm::qualifier)0> local_58;
  undefined1 local_48 [8];
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  float invnorm;
  float phi;
  float sqrt5;
  size_t _iterations_local;
  float _radius_local;
  Mesh *mesh;
  
  dVar16 = std::sqrt(5.35679601527854e-315);
  fVar14 = (SUB84(dVar16,0) + 1.0) * 0.5;
  dVar16 = std::sqrt((double)(ulong)(uint)(fVar14 * fVar14 + 1.0));
  vertices.
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1.0 / SUB84(dVar16,0);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)local_48);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,float,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_64,-1,fVar14,0);
  local_88 = glm::operator*(fVar15,&local_64);
  local_58 = local_88;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_58);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,float,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_a4,1,fVar14,0);
  local_b8 = glm::operator*(fVar15,&local_a4);
  local_98 = local_b8;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_98);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
            ((vec<3,float,(glm::qualifier)0> *)&local_d4,0,1,-fVar14);
  local_e8 = glm::operator*(fVar15,&local_d4);
  local_c8 = local_e8;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_c8);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
            ((vec<3,float,(glm::qualifier)0> *)&local_104,0,1,fVar14);
  local_118 = glm::operator*(fVar15,&local_104);
  local_f8 = local_118;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_f8);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<float,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_134,-fVar14,0,-1);
  local_148 = glm::operator*(fVar15,&local_134);
  local_128 = local_148;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_128);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<float,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_164,-fVar14,0,1);
  local_178 = glm::operator*(fVar15,&local_164);
  local_158 = local_178;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_158);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<float,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_194,fVar14,0,-1);
  local_1a8 = glm::operator*(fVar15,&local_194);
  local_188 = local_1a8;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_188);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<float,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_1c4,fVar14,0,1);
  local_1d8 = glm::operator*(fVar15,&local_1c4);
  local_1b8 = local_1d8;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_1b8);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
            ((vec<3,float,(glm::qualifier)0> *)&local_1f4,0,-1,-fVar14);
  local_208 = glm::operator*(fVar15,&local_1f4);
  local_1e8 = local_208;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_1e8);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,float>
            ((vec<3,float,(glm::qualifier)0> *)&local_224,0,-1,fVar14);
  local_238 = glm::operator*(fVar15,&local_224);
  local_218 = local_238;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_218);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,float,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_254,-1,-fVar14,0);
  local_268 = glm::operator*(fVar15,&local_254);
  local_248 = local_268;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_248);
  fVar15 = vertices.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  glm::vec<3,float,(glm::qualifier)0>::vec<int,float,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_284,1,-fVar14,0);
  vVar17 = glm::operator*(fVar15,&local_284);
  local_278.field_2 = vVar17.field_2;
  local_798 = vVar17.field_0;
  aStack_794 = vVar17.field_1;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = local_798;
  indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = aStack_794;
  local_278._0_8_ = vVar17._0_8_;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               *)local_48,&local_278);
  memcpy(local_3b0,&DAT_005e2ae0,0xf0);
  local_2b8 = 0x3c;
  local_2c0 = local_3b0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&size + 7));
  __l._M_len = local_2b8;
  __l._M_array = local_2c0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,__l,
             (allocator<unsigned_int> *)((long)&size + 7));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&size + 7));
  iteration = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0);
  for (newFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      newFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < _iterations;
      newFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)newFaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    iteration = iteration << 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    for (_i2 = 0; _i2 < iteration / 0xc; _i2 = _i2 + 1) {
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,_i2 * 3);
      i3 = *pvVar6;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                          _i2 * 3 + 1);
      local_3f0 = *pvVar6;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                          _i2 * 3 + 2);
      i12._4_4_ = *pvVar6;
      sVar7 = std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                      *)local_48);
      vVar5 = (value_type_conflict4)sVar7;
      i13._0_4_ = vVar5 + 1;
      v1.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)(vVar5 + 2);
      pvVar8 = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             *)local_48,(ulong)i3);
      v2.field_2 = pvVar8->field_0;
      unique0x00012004 = pvVar8->field_1;
      pvVar8 = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             *)local_48,(ulong)local_3f0);
      v2.field_0 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    &pvVar8->field_2;
      v3.field_2 = pvVar8->field_0;
      unique0x00012004 = pvVar8->field_1;
      pvVar8 = std::
               vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                             *)local_48,(ulong)i12._4_4_);
      v3.field_0 = *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                    &pvVar8->field_2;
      local_440._0_4_ = pvVar8->field_0;
      local_440._4_4_ = pvVar8->field_1;
      vVar17 = glm::operator+((vec<3,_float,_(glm::qualifier)0> *)&v2.field_2,
                              (vec<3,_float,_(glm::qualifier)0> *)&v3.field_2);
      local_470 = vVar17;
      local_460 = vVar17;
      vVar17 = glm::normalize<3,float,(glm::qualifier)0>(&local_460);
      local_480 = vVar17;
      local_450 = vVar17;
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)local_48,&local_450);
      vVar17 = glm::operator+((vec<3,_float,_(glm::qualifier)0> *)&v3.field_2,
                              (vec<3,_float,_(glm::qualifier)0> *)local_440);
      local_4b0 = vVar17;
      local_4a0 = vVar17;
      vVar17 = glm::normalize<3,float,(glm::qualifier)0>(&local_4a0);
      local_4c0 = vVar17;
      local_490 = vVar17;
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)local_48,&local_490);
      vVar17 = glm::operator+((vec<3,_float,_(glm::qualifier)0> *)&v2.field_2,
                              (vec<3,_float,_(glm::qualifier)0> *)local_440);
      local_4f0 = vVar17;
      local_4e0 = vVar17;
      vVar17 = glm::normalize<3,float,(glm::qualifier)0>(&local_4e0);
      local_4f8 = vVar17.field_2;
      local_878 = vVar17.field_0;
      aStack_874 = vVar17.field_1;
      local_500 = local_878;
      aStack_4fc = aStack_874;
      local_4d0._0_8_ = vVar17._0_8_;
      local_4d0.field_2 = local_4f8;
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *)local_48,&local_4d0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&i3);
      local_504 = vVar5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_504);
      local_508 = v1.field_2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                 (value_type_conflict4 *)&local_508);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_3f0);
      local_50c = (value_type_conflict4)i13;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_50c);
      local_510 = vVar5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_510);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                 (value_type_conflict4 *)((long)&i12 + 4));
      local_514 = v1.field_2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                 (value_type_conflict4 *)&local_514);
      local_518 = (value_type_conflict4)i13;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_518);
      local_51c = vVar5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_51c);
      local_520 = (value_type_conflict4)i13;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_520);
      texCoords.
      super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = v1.field_2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                 (value_type_conflict4 *)
                 ((long)&texCoords.
                         super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::swap
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  }
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)&i_1);
  vec = (value_type *)0x0;
  while( true ) {
    pvVar9 = (value_type *)
             std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                     *)local_48);
    if (pvVar9 <= vec) break;
    pvVar8 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           *)local_48,(size_type)vec);
    fVar15 = sqrtf((pvVar8->field_0).x * (pvVar8->field_0).x +
                   (pvVar8->field_2).z * (pvVar8->field_2).z);
    fVar14 = atan2f((pvVar8->field_2).z,(pvVar8->field_0).x);
    fVar15 = atan2f((pvVar8->field_1).y,fVar15);
    glm::vec<2,float,(glm::qualifier)0>::vec<double,float>
              ((vec<2,float,(glm::qualifier)0> *)
               &indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,1.0 - (double)(fVar14 / 6.2831855 + 0.5),
               1.0 - (fVar15 / 3.1415927 + 0.5));
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 *)&i_1,(value_type *)
                        &indexToSplit.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    vec = (value_type *)((long)&vec->field_0 + 1);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i_2);
  t0.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  t0.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  while( true ) {
    sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0);
    if (sVar7 / 3 <= (ulong)t0) break;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                        (long)t0 * 3);
    this = (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            *)&i_1;
    pvVar10 = std::
              vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ::operator[](this,(ulong)*pvVar6);
    vVar4 = *pvVar10;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                        (long)t0 * 3 + 1);
    pvVar10 = std::
              vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ::operator[](this,(ulong)*pvVar6);
    t2 = *pvVar10;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                        (long)t0 * 3 + 2);
    pvVar10 = std::
              vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ::operator[](this,(ulong)*pvVar6);
    local_5a0 = *pvVar10;
    __x = (int)this;
    std::abs(__x);
    t1.field_0 = vVar4.field_0;
    if (0.5 < extraout_XMM0_Da) {
      if (0.5 <= t1.field_0.x) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                            (long)t0 * 3 + 2);
        local_5a8 = *pvVar6;
        pvVar13 = (vector<int,_std::allocator<int>_> *)&i_2;
        std::vector<int,_std::allocator<int>_>::push_back
                  (pvVar13,(value_type_conflict5 *)&local_5a8);
        __x = (int)pvVar13;
      }
      else {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                            (long)t0 * 3);
        local_5a4 = *pvVar6;
        pvVar13 = (vector<int,_std::allocator<int>_> *)&i_2;
        std::vector<int,_std::allocator<int>_>::push_back
                  (pvVar13,(value_type_conflict5 *)&local_5a4);
        __x = (int)pvVar13;
      }
    }
    std::abs(__x);
    if (0.5 < extraout_XMM0_Da_00) {
      if (0.5 <= t1.field_0.x) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                            (long)t0 * 3 + 1);
        local_5b0 = *pvVar6;
        pvVar13 = (vector<int,_std::allocator<int>_> *)&i_2;
        std::vector<int,_std::allocator<int>_>::push_back
                  (pvVar13,(value_type_conflict5 *)&local_5b0);
        __x = (int)pvVar13;
      }
      else {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                            (long)t0 * 3);
        local_5ac = *pvVar6;
        pvVar13 = (vector<int,_std::allocator<int>_> *)&i_2;
        std::vector<int,_std::allocator<int>_>::push_back
                  (pvVar13,(value_type_conflict5 *)&local_5ac);
        __x = (int)pvVar13;
      }
    }
    std::abs(__x);
    if (0.5 < extraout_XMM0_Da_01) {
      if (0.5 <= t2.field_0.x) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                            (long)t0 * 3 + 2);
        i_3._0_4_ = *pvVar6;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&i_2,(value_type_conflict5 *)&i_3);
      }
      else {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                            (long)t0 * 3 + 1);
        i_3._4_4_ = *pvVar6;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&i_2,
                   (value_type_conflict5 *)((long)&i_3 + 4));
      }
    }
    t0 = (vec2)((long)t0 + 1);
  }
  stack0xfffffffffffffa40 = 0;
  do {
    sVar7 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&i_2);
    if (sVar7 <= stack0xfffffffffffffa40) {
      Mesh::Mesh(__return_storage_ptr__);
      Mesh::addNormals(__return_storage_ptr__,
                       (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        *)local_48);
      Mesh::addTexCoords(__return_storage_ptr__,
                         (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                          *)&i_1);
      local_608 = 0;
      while( true ) {
        sVar7 = std::
                vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                        *)local_48);
        if (sVar7 <= local_608) break;
        pvVar8 = std::
                 vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                               *)local_48,local_608);
        glm::vec<3,float,(glm::qualifier)0>::operator*=
                  ((vec<3,float,(glm::qualifier)0> *)pvVar8,_radius);
        local_608 = local_608 + 1;
      }
      Mesh::addVertices(__return_storage_ptr__,
                        (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         *)local_48);
      Mesh::addIndices(__return_storage_ptr__,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0);
      Mesh::computeTangents(__return_storage_ptr__);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i_2);
      std::
      vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
      ::~vector((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 *)&i_1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0);
      std::
      vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ::~vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 *)local_48);
      return __return_storage_ptr__;
    }
    puVar11 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)&i_2,stack0xfffffffffffffa40);
    uVar1 = *puVar11;
    pvVar8 = std::
             vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ::operator[]((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           *)local_48,(ulong)uVar1);
    t.field_0 = *(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)&pvVar8->field_0;
    t.field_1 = *(anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5 *)&pvVar8->field_1;
    pvVar10 = std::
              vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                            *)&i_1,(ulong)uVar1);
    glm::vec<2,_float,_(glm::qualifier)0>::vec
              ((vec<2,_float,_(glm::qualifier)0> *)&newIndex,1.0,0.0);
    local_5d8 = glm::operator+(pvVar10,(vec<2,_float,_(glm::qualifier)0> *)&newIndex);
    std::
    vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::push_back((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                 *)local_48,(value_type *)&t);
    std::
    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::push_back((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                 *)&i_1,&local_5d8);
    sVar7 = std::
            vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ::size((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    *)local_48);
    _index2 = 0;
    while( true ) {
      sVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0);
      if (sVar12 <= _index2) break;
      pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,_index2);
      if (*pvVar6 == uVar1) {
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                            (_index2 + 1) % 3 + (_index2 / 3) * 3);
        uVar2 = *pvVar6;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,
                            (_index2 + 2) % 3 + (_index2 / 3) * 3);
        uVar3 = *pvVar6;
        pvVar10 = std::
                  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                  ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                *)&i_1,(ulong)uVar2);
        if ((pvVar10->field_0).x <= 0.5) {
          pvVar10 = std::
                    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ::operator[]((vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                                  *)&i_1,(ulong)uVar3);
          if ((pvVar10->field_0).x <= 0.5) goto LAB_0043f5a3;
        }
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2b0,_index2
                           );
        *pvVar6 = (int)sVar7 - 1;
      }
LAB_0043f5a3:
      _index2 = _index2 + 1;
    }
    register0x00000000 = stack0xfffffffffffffa40 + 1;
  } while( true );
}

Assistant:

Mesh icosphereMesh(float _radius, size_t _iterations) {

    /// Step 1 : Generate icosahedron
    const float sqrt5 = sqrt(5.0f);
    const float phi = (1.0f + sqrt5) * 0.5f;
    const float invnorm = 1/sqrt(phi*phi+1);

    std::vector<glm::vec3> vertices;
    vertices.push_back(invnorm * glm::vec3(-1,  phi, 0));//0
    vertices.push_back(invnorm * glm::vec3( 1,  phi, 0));//1
    vertices.push_back(invnorm * glm::vec3(0,   1,  -phi));//2
    vertices.push_back(invnorm * glm::vec3(0,   1,   phi));//3
    vertices.push_back(invnorm * glm::vec3(-phi,0,  -1));//4
    vertices.push_back(invnorm * glm::vec3(-phi,0,   1));//5
    vertices.push_back(invnorm * glm::vec3( phi,0,  -1));//6
    vertices.push_back(invnorm * glm::vec3( phi,0,   1));//7
    vertices.push_back(invnorm * glm::vec3(0,   -1, -phi));//8
    vertices.push_back(invnorm * glm::vec3(0,   -1,  phi));//9
    vertices.push_back(invnorm * glm::vec3(-1,  -phi,0));//10
    vertices.push_back(invnorm * glm::vec3( 1,  -phi,0));//11
       
    std::vector<INDEX_TYPE> indices = {
        0,1,2,
        0,3,1,
        0,4,5,
        1,7,6,
        1,6,2,
        1,3,7,
        0,2,4,
        0,5,3,
        2,6,8,
        2,8,4,
        3,5,9,
        3,9,7,
        11,6,7,
        10,5,4,
        10,4,8,
        10,9,5,
        11,8,6,
        11,7,9,
        10,8,11,
        10,11,9
    };

    size_t size = indices.size();

    /// Step 2 : tessellate
    for (size_t iteration = 0; iteration < _iterations; iteration++) {
        size*=4;
        std::vector<INDEX_TYPE> newFaces;
        for (size_t i = 0; i < size/12; i++) {
            INDEX_TYPE i1 = indices[i*3];
            INDEX_TYPE i2 = indices[i*3+1];
            INDEX_TYPE i3 = indices[i*3+2];
            size_t i12 = vertices.size();
            size_t i23 = i12+1;
            size_t i13 = i12+2;
            glm::vec3 v1 = vertices[i1];
            glm::vec3 v2 = vertices[i2];
            glm::vec3 v3 = vertices[i3];
            //make 1 vertice at the center of each edge and project it onto the sphere
            vertices.push_back(glm::normalize(v1+v2));
            vertices.push_back(glm::normalize(v2+v3));
            vertices.push_back(glm::normalize(v1+v3));
            //now recreate indices
            newFaces.push_back(i1);
            newFaces.push_back(i12);
            newFaces.push_back(i13);
            newFaces.push_back(i2);
            newFaces.push_back(i23);
            newFaces.push_back(i12);
            newFaces.push_back(i3);
            newFaces.push_back(i13);
            newFaces.push_back(i23);
            newFaces.push_back(i12);
            newFaces.push_back(i23);
            newFaces.push_back(i13);
        }
        indices.swap(newFaces);
    }

    /// Step 3 : generate texcoords
    std::vector<glm::vec2> texCoords;
    for (size_t i = 0; i < vertices.size(); i++) {
        const auto& vec = vertices[i];
        float u, v;
        float r0 = sqrtf(vec.x*vec.x+vec.z*vec.z);
        float alpha;
        alpha = atan2f(vec.z,vec.x);
        u = alpha/TAU+.5f;
        v = atan2f(vec.y, r0)/PI + .5f;
        // reverse the u coord, so the default is texture mapped left to
        // right on the outside of a sphere 
        // reverse the v coord, so that texture origin is at top left
        texCoords.push_back(glm::vec2(1.0-u,1.f-v));
    }

    /// Step 4 : fix texcoords
    // find vertices to split
    std::vector<int> indexToSplit;

    for (size_t i=0; i<indices.size()/3; i++) {
        glm::vec2 t0 = texCoords[indices[i*3+0]];
        glm::vec2 t1 = texCoords[indices[i*3+1]];
        glm::vec2 t2 = texCoords[indices[i*3+2]];

        if (std::abs(t2.x-t0.x)>0.5) {
            if (t0.x<0.5)
                indexToSplit.push_back(indices[i*3]);
            else
                indexToSplit.push_back(indices[i*3+2]);
        }
        if (std::abs(t1.x-t0.x)>0.5) {
            if (t0.x<0.5)
                indexToSplit.push_back(indices[i*3]);
            else
                indexToSplit.push_back(indices[i*3+1]);
        }
        if (std::abs(t2.x-t1.x)>0.5) {
            if (t1.x<0.5)
                indexToSplit.push_back(indices[i*3+1]);
            else
                indexToSplit.push_back(indices[i*3+2]);
        }
    }

    //split vertices
    for (size_t i = 0; i < indexToSplit.size(); i++) {
        INDEX_TYPE index = indexToSplit[i];
        //duplicate vertex
        glm::vec3 v = vertices[index];
        glm::vec2 t = texCoords[index] + glm::vec2(1.f, 0.f);
        vertices.push_back(v);
        texCoords.push_back(t);
        size_t newIndex = vertices.size()-1;
        //reassign indices
        for (size_t j = 0; j<indices.size(); j++) {
            if (indices[j] == index) {
                INDEX_TYPE index1 = indices[(j+1)%3+(j/3)*3];
                INDEX_TYPE index2 = indices[(j+2)%3+(j/3)*3];
                if ((texCoords[index1].x>0.5) || (texCoords[index2].x>0.5))
                    indices[j] = newIndex;
            }
        }
    }

    Mesh mesh;
    mesh.addNormals( vertices );
    mesh.addTexCoords( texCoords );

    for (size_t i = 0; i < vertices.size(); i++ )
        vertices[i] *= _radius;

    mesh.addVertices( vertices );
    mesh.addIndices( indices );
    mesh.computeTangents();

    return  mesh;
}